

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O2

void ws::log_helper<char_const(&)[12]>(Severity severity,FormatWithLoc *fmt,char (*args) [12])

{
  time_point time_point_;
  Record rec;
  string local_80;
  undefined1 local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  get_logger_instance();
  if (get_logger_instance::instance.mode != none) {
    time_point_.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    Record::Record((Record *)local_60,time_point_,severity,(fmt->loc)._M_impl);
    std::__cxx11::string::string((string *)&local_80,&fmt->fmt);
    std::__cxx11::string::~string((string *)&local_80);
    if (local_80._M_string_length == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_60 + 0x20),*args);
    }
    else {
      std::__cxx11::string::string((string *)&local_80,&fmt->fmt);
      Record::add_fmt<char_const(&)[12]>((Record *)local_60,&local_80,args);
      std::__cxx11::string::~string((string *)&local_80);
    }
    get_logger_instance();
    Logger::add(&get_logger_instance::instance,(Record *)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 0x20));
  }
  return;
}

Assistant:

void log_helper(Severity severity, const FormatWithLoc &fmt, Args &&...args)
  {
    if (get_logger_instance().get_mode() == Output::none)
    {
      return;
    }
    Record rec(std::chrono::system_clock::now(), severity, fmt.get_loc());
    if (fmt.get_fmt().empty())
    {
      rec.add(std::forward<Args>(args)...);
    }
    else
    {
      rec.add_fmt(fmt.get_fmt(), std::forward<Args>(args)...);
    }
    get_logger_instance().add(rec);
  }